

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

TargetPropertyEntry *
CreateTargetPropertyEntry
          (string *propertyValue,cmListFileBacktrace *backtrace,bool evaluateForBuildsystem)

{
  size_type *psVar1;
  pointer pcVar2;
  element_type *peVar3;
  cmLinkImplItem *pcVar4;
  undefined1 auVar5 [8];
  size_type sVar6;
  TargetPropertyEntry *pTVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  undefined1 local_80 [8];
  string local_78;
  element_type **local_50;
  cmLinkImplItem *local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_38;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_30;
  
  sVar6 = cmGeneratorExpression::Find(propertyValue);
  if (sVar6 == 0xffffffffffffffff) {
    pTVar7 = (TargetPropertyEntry *)operator_new(0x50);
    pcVar2 = (propertyValue->_M_dataplus)._M_p;
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + propertyValue->_M_string_length);
    peVar3 = (backtrace->TopEntry).
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    pcVar4 = (cmLinkImplItem *)
             (backtrace->TopEntry).
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (pcVar4 != (cmLinkImplItem *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(pcVar4->super_cmLinkItem).String._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(pcVar4->super_cmLinkItem).String._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
    pTVar7->LinkImplItem = &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
    (pTVar7->Backtrace).TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pTVar7->Backtrace).TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pTVar7->_vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryString_005cb440;
    pTVar7[1]._vptr_TargetPropertyEntry = (_func_int **)&pTVar7[1].Backtrace;
    if (local_50 == &local_40) {
      pTVar7[1].Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_40;
      pTVar7[1].Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Stack_38;
    }
    else {
      pTVar7[1]._vptr_TargetPropertyEntry = (_func_int **)local_50;
      pTVar7[1].Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_40;
    }
    pTVar7[1].LinkImplItem = local_48;
    pTVar7[2]._vptr_TargetPropertyEntry = (_func_int **)peVar3;
    pTVar7[2].LinkImplItem = pcVar4;
  }
  else {
    local_78.field_2._M_allocated_capacity =
         (size_type)
         (backtrace->TopEntry).
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78.field_2._8_8_ =
         (backtrace->TopEntry).
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    (backtrace->TopEntry).
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (backtrace->TopEntry).
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)(local_80 + 8),(cmListFileBacktrace *)&local_78.field_2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.field_2._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.field_2._8_8_);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_80,(string *)(local_80 + 8));
    auVar5 = local_80;
    *(bool *)((long)local_80 + 0x168) = evaluateForBuildsystem;
    pTVar7 = (TargetPropertyEntry *)operator_new(0x28);
    local_80 = (undefined1  [8])0x0;
    pTVar7->LinkImplItem = &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
    (pTVar7->Backtrace).TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pTVar7->Backtrace).TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pTVar7->_vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryGenex_005cb388;
    pTVar7[1]._vptr_TargetPropertyEntry = (_func_int **)auVar5;
    local_30._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          )(_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            )0x0;
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_30);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_80);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_80 + 8));
  }
  return pTVar7;
}

Assistant:

cmGeneratorTarget::TargetPropertyEntry* CreateTargetPropertyEntry(
  const std::string& propertyValue,
  cmListFileBacktrace backtrace = cmListFileBacktrace(),
  bool evaluateForBuildsystem = false)
{
  if (cmGeneratorExpression::Find(propertyValue) != std::string::npos) {
    cmGeneratorExpression ge(std::move(backtrace));
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(propertyValue);
    cge->SetEvaluateForBuildsystem(evaluateForBuildsystem);
    return new TargetPropertyEntryGenex(std::move(cge));
  }

  return new TargetPropertyEntryString(propertyValue, backtrace);
}